

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

lbool __thiscall Minisat::Solver::search(Solver *this,int nof_conflicts)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  bool bVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  bool bVar10;
  byte bVar11;
  CRef CVar12;
  int iVar13;
  Lit LVar14;
  ulong uVar15;
  long lVar16;
  Size *pSVar17;
  byte bVar18;
  byte bVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  vec<unsigned_int,_int> *this_00;
  ClauseAllocator *this_01;
  float fVar23;
  double dVar24;
  CRef cr;
  vec<Minisat::Lit,_int> learnt_clause;
  int backtrack_level;
  byte local_ad;
  CRef local_ac;
  vec<Minisat::Lit,_int> local_a8;
  vec<unsigned_int,_int> *local_90;
  ulong local_88;
  int local_7c;
  uint local_78;
  int local_74;
  vec<int,_int> *local_70;
  LSet *local_68;
  Size *local_60;
  ClauseAllocator *local_58;
  double local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (this->ok == false) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x2c0,"lbool Minisat::Solver::search(int)");
  }
  local_a8.data = (Lit *)0x0;
  local_a8.sz = 0;
  local_a8.cap = 0;
  this->starts = this->starts + 1;
  this_01 = &this->ca;
  this_00 = &this->learnts;
  local_60 = &(this->trail).sz;
  local_70 = &this->trail_lim;
  local_68 = &this->conflict;
  local_88 = 0;
  local_90 = this_00;
  local_7c = nof_conflicts;
  local_58 = this_01;
  do {
    CVar12 = propagate(this);
    if (CVar12 == 0xffffffff) {
      if ((((nof_conflicts <= (int)local_88 && -1 < nof_conflicts) ||
           (this->asynch_interrupt != false)) ||
          ((-1 < this->conflict_budget && ((ulong)this->conflict_budget <= this->conflicts)))) ||
         ((-1 < this->propagation_budget && ((ulong)this->propagation_budget <= this->propagations))
         )) {
        dVar24 = progressEstimate(this);
        this->progress_estimate = dVar24;
        cancelUntil(this,0);
        bVar11 = l_Undef;
        goto LAB_0010ac12;
      }
      if (((this->trail_lim).sz == 0) && (bVar10 = simplify(this), bVar11 = l_False, !bVar10))
      goto LAB_0010ac12;
      if (this->max_learnts <= (double)((this->learnts).sz - (this->trail).sz)) {
        reduceDB(this);
      }
      uVar22 = 0xfffffffe;
      do {
        iVar13 = (this->trail_lim).sz;
        LVar14.x = uVar22;
        if ((this->assumptions).sz <= iVar13) goto LAB_0010abde;
        LVar14.x = (this->assumptions).data[iVar13].x;
        if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz
            <= LVar14.x >> 1) {
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                        ,0x27,
                        "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        bVar11 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
                 map.data[LVar14.x >> 1].value;
        bVar18 = (byte)LVar14.x & 1 ^ bVar11;
        bVar19 = l_True & 2;
        bVar6 = (bVar19 & bVar11) == 0;
        bVar10 = bVar18 == l_True && bVar19 == 0 || !bVar6;
        if ((bVar18 != l_True || bVar19 != 0) && bVar6) {
          if (bVar18 == l_False && (l_False & 2) == 0 || (l_False & 2 & bVar11) != 0) {
            analyzeFinal(this,(Lit)(LVar14.x ^ 1),local_68);
            iVar13 = 1;
            local_ad = l_False;
            LVar14.x = uVar22;
          }
          else {
            iVar13 = 5;
          }
        }
        else {
          local_ac = (this->trail).sz;
          vec<int,_int>::push(local_70,(int *)&local_ac);
          iVar13 = 0;
          LVar14.x = uVar22;
        }
        uVar22 = LVar14.x;
      } while (iVar13 == 0);
      this_00 = local_90;
      if (iVar13 == 5) {
LAB_0010abde:
        if (LVar14.x == 0xfffffffe) {
          this->decisions = this->decisions + 1;
          LVar14 = pickBranchLit(this);
          if (LVar14.x == -2) {
            local_ad = l_True;
            bVar10 = false;
            this_00 = local_90;
            goto LAB_0010ac18;
          }
        }
        local_ac = (this->trail).sz;
        vec<int,_int>::push(local_70,(int *)&local_ac);
        uncheckedEnqueue(this,LVar14,0xffffffff);
        bVar10 = true;
        this_00 = local_90;
      }
    }
    else {
      this->conflicts = this->conflicts + 1;
      local_88 = (ulong)((int)local_88 + 1);
      bVar11 = l_False;
      if ((this->trail_lim).sz != 0) {
        if (local_a8.data != (Lit *)0x0) {
          local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
        }
        analyze(this,CVar12,&local_a8,&local_74);
        cancelUntil(this,local_74);
        if (local_a8.sz == 1) {
          LVar14.x = (local_a8.data)->x;
          CVar12 = 0xffffffff;
        }
        else {
          local_ac = ClauseAllocator::alloc(this_01,&local_a8,true);
          vec<unsigned_int,_int>::push(this_00,&local_ac);
          attachClause(this,local_ac);
          uVar20 = (ulong)local_ac;
          if ((this->ca).ra.sz <= local_ac) {
LAB_0010ac8b:
            __assert_fail("r < sz",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                          ,0x3f,
                          "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                         );
          }
          puVar4 = (this->ca).ra.memory;
          if ((puVar4[uVar20] & 8) == 0) {
LAB_0010acaa:
            __assert_fail("header.has_extra",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/SolverTypes.h"
                          ,0xd6,"float &Minisat::Clause::activity()");
          }
          uVar15 = (ulong)(puVar4[uVar20] >> 5);
          dVar24 = this->cla_inc;
          fVar23 = (float)((double)(float)puVar4[uVar20 + uVar15 + 1] + dVar24);
          puVar4[uVar20 + uVar15 + 1] = (uint)fVar23;
          if (1e+20 < fVar23) {
            lVar16 = (long)(this->learnts).sz;
            if (0 < lVar16) {
              puVar4 = (this->learnts).data;
              puVar5 = (this->ca).ra.memory;
              uVar22 = (this->ca).ra.sz;
              lVar21 = 0;
              do {
                uVar2 = puVar4[lVar21];
                if (uVar22 <= uVar2) goto LAB_0010ac8b;
                if ((puVar5[uVar2] & 8) == 0) goto LAB_0010acaa;
                uVar20 = (ulong)(puVar5[uVar2] >> 5);
                puVar5[(ulong)uVar2 + uVar20 + 1] =
                     (uint)((float)puVar5[(ulong)uVar2 + uVar20 + 1] * 1e-20);
                lVar21 = lVar21 + 1;
              } while (lVar16 != lVar21);
            }
            this->cla_inc = dVar24 * 1e-20;
          }
          LVar14.x = (local_a8.data)->x;
          CVar12 = local_ac;
        }
        uncheckedEnqueue(this,LVar14,CVar12);
        this->var_inc = (1.0 / this->var_decay) * this->var_inc;
        this->cla_inc = (1.0 / this->clause_decay) * this->cla_inc;
        piVar1 = &this->learntsize_adjust_cnt;
        *piVar1 = *piVar1 + -1;
        bVar10 = true;
        if (*piVar1 == 0) {
          dVar24 = this->learntsize_adjust_inc * this->learntsize_adjust_confl;
          this->learntsize_adjust_confl = dVar24;
          this->learntsize_adjust_cnt = (int)dVar24;
          dVar24 = this->learntsize_inc * this->max_learnts;
          this->max_learnts = dVar24;
          if (0 < this->verbosity) {
            pSVar17 = local_60;
            if ((this->trail_lim).sz != 0) {
              pSVar17 = (this->trail_lim).data;
            }
            uVar7 = this->conflicts;
            uVar8 = this->dec_vars;
            uVar9 = this->num_clauses;
            local_78 = (uint)this->clauses_literals;
            iVar13 = (int)this->num_learnts;
            local_48 = (undefined4)this->learnts_literals;
            uStack_40 = (undefined4)(this->learnts_literals >> 0x20);
            uStack_44 = 0x43300000;
            uStack_3c = 0x45300000;
            iVar3 = *pSVar17;
            local_50 = dVar24;
            dVar24 = progressEstimate(this);
            printf("| %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n",
                   SUB84((((double)CONCAT44(uStack_3c,uStack_40) - 1.9342813113834067e+25) +
                         ((double)CONCAT44(uStack_44,local_48) - 4503599627370496.0)) /
                         (double)iVar13,0),dVar24 * 100.0,(ulong)(uint)uVar7,
                   (ulong)(uint)((int)uVar8 - iVar3),(ulong)(uint)uVar9,(ulong)local_78,
                   (ulong)(uint)(int)local_50,iVar13);
            this_00 = local_90;
            this_01 = local_58;
            nof_conflicts = local_7c;
          }
        }
        goto LAB_0010ac18;
      }
LAB_0010ac12:
      bVar10 = false;
      local_ad = bVar11;
    }
LAB_0010ac18:
    if (!bVar10) {
      if (local_a8.data != (Lit *)0x0) {
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
        free(local_a8.data);
      }
      return (lbool)local_ad;
    }
  } while( true );
}

Assistant:

lbool Solver::search(int nof_conflicts)
{
    assert(ok);
    int         backtrack_level;
    int         conflictC = 0;
    vec<Lit>    learnt_clause;
    starts++;

    for (;;){
        CRef confl = propagate();
        if (confl != CRef_Undef){
            // CONFLICT
            conflicts++; conflictC++;
            if (decisionLevel() == 0) return l_False;

            learnt_clause.clear();
            analyze(confl, learnt_clause, backtrack_level);
            cancelUntil(backtrack_level);

            if (learnt_clause.size() == 1){
                uncheckedEnqueue(learnt_clause[0]);
            }else{
                CRef cr = ca.alloc(learnt_clause, true);
                learnts.push(cr);
                attachClause(cr);
                claBumpActivity(ca[cr]);
                uncheckedEnqueue(learnt_clause[0], cr);
            }

            varDecayActivity();
            claDecayActivity();

            if (--learntsize_adjust_cnt == 0){
                learntsize_adjust_confl *= learntsize_adjust_inc;
                learntsize_adjust_cnt    = (int)learntsize_adjust_confl;
                max_learnts             *= learntsize_inc;

                if (verbosity >= 1)
                    printf("| %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n", 
                           (int)conflicts, 
                           (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals, 
                           (int)max_learnts, nLearnts(), (double)learnts_literals/nLearnts(), progressEstimate()*100);
            }

        }else{
            // NO CONFLICT
            if ((nof_conflicts >= 0 && conflictC >= nof_conflicts) || !withinBudget()){
                // Reached bound on number of conflicts:
                progress_estimate = progressEstimate();
                cancelUntil(0);
                return l_Undef; }

            // Simplify the set of problem clauses:
            if (decisionLevel() == 0 && !simplify())
                return l_False;

            if (learnts.size()-nAssigns() >= max_learnts)
                // Reduce the set of learnt clauses:
                reduceDB();

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()){
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True){
                    // Dummy decision level:
                    newDecisionLevel();
                }else if (value(p) == l_False){
                    analyzeFinal(~p, conflict);
                    return l_False;
                }else{
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef){
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef)
                    // Model found:
                    return l_True;
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            uncheckedEnqueue(next);
        }
    }
}